

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_RC TPM2_SequenceComplete
                 (TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT sequenceHandle,
                 TPM2B_MAX_BUFFER *buffer,TPMI_RH_HIERARCHY hierarchy,TPM2B_DIGEST *result,
                 TPMT_TK_HASHCHECK *validation)

{
  ushort uVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  TPM_RC TVar4;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT CmdCtx;
  INT32 local_30ac;
  BYTE *local_30a8;
  TPMI_RH_HIERARCHY local_30a0;
  TPMI_DH_OBJECT local_309c;
  TSS_SESSION *local_3098;
  TPMT_TK_HASHCHECK local_308c;
  TSS_CMD_CONTEXT local_3040;
  
  local_30ac = 0x1000;
  local_30a8 = local_3040.ParamBuffer;
  local_3040.ParamSize = 0;
  local_30a0 = hierarchy;
  local_309c = sequenceHandle;
  local_3098 = session;
  if (buffer == (TPM2B_MAX_BUFFER *)0x0) {
    uVar1 = UINT16_Marshal(&NullSize,&local_30a8,&local_30ac);
  }
  else {
    uVar1 = TPM2B_MAX_BUFFER_Marshal(buffer,&local_30a8,&local_30ac);
  }
  local_3040.ParamSize = uVar1 + local_3040.ParamSize;
  UVar2 = UINT32_Marshal(&local_30a0,&local_30a8,&local_30ac);
  local_3040.ParamSize = local_3040.ParamSize + UVar2;
  TVar3 = TSS_DispatchCmd(tpm,0x13e,&local_309c,1,&local_3098,1,&local_3040);
  if (TVar3 == 0) {
    TVar4 = TPM2B_DIGEST_Unmarshal(result,&local_3040.RespBufPtr,(INT32 *)&local_3040.RespBytesLeft)
    ;
    TVar3 = 0x9a;
    if (TVar4 == 0) {
      if (validation == (TPMT_TK_HASHCHECK *)0x0) {
        validation = &local_308c;
      }
      TVar4 = TPMT_TK_HASHCHECK_Unmarshal
                        (validation,&local_3040.RespBufPtr,(INT32 *)&local_3040.RespBytesLeft);
      if (TVar4 == 0) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2_SequenceComplete(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          sequenceHandle,     // IN
    TPM2B_MAX_BUFFER       *buffer,             // IN
    TPMI_RH_HIERARCHY       hierarchy,          // IN [opt]
    TPM2B_DIGEST           *result,             // OUT
    TPMT_TK_HASHCHECK      *validation          // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, buffer);
    TSS_MARSHAL(TPMI_RH_HIERARCHY, &hierarchy);
    DISPATCH_CMD(SequenceComplete, &sequenceHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_DIGEST, result);
    TSS_UNMARSHAL_OPT(TPMT_TK_HASHCHECK, validation);
    END_CMD();
}